

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

CheckerInstanceSymbol *
slang::ast::CheckerInstanceSymbol::createInvalid(CheckerSymbol *checker,uint32_t depth)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  size_t sVar4;
  group_type_pointer pgVar5;
  ulong uVar6;
  SyntaxNode *pSVar7;
  SyntaxNode *pSVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  int iVar11;
  AssertionInstanceDetails *args_2;
  ulong pos0;
  CheckerInstanceSymbol *pCVar12;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  Compilation *this;
  long lVar13;
  ulong uVar14;
  ulong hash;
  Scope *pSVar15;
  value_type_pointer ppVar16;
  pointer ppAVar17;
  uint uVar18;
  ulong uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  undefined1 auVar24 [16];
  LookupLocation LVar25;
  try_emplace_args_t local_1b9;
  AssertionInstanceDetails *local_1b8;
  CheckerInstanceBodySymbol *local_1b0;
  SyntaxNode *local_1a8;
  Compilation *local_1a0;
  Symbol *actualArg;
  CheckerSymbol *local_190;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
  *local_188;
  pointer local_180;
  ExpressionSyntax *outputInitialSyntax;
  uint32_t depth_local;
  undefined1 local_168 [16];
  bitmask<slang::ast::ASTFlags> local_158;
  Symbol *pSStack_150;
  TempVarSymbol *local_148;
  RandomizeDetails *pRStack_140;
  AssertionInstanceDetails *local_138;
  _Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false> local_130;
  undefined1 local_128 [24];
  Symbol *pSStack_110;
  undefined1 local_108 [16];
  AssertionInstanceDetails *local_f8;
  locator res;
  SmallVector<slang::ast::CheckerInstanceSymbol::Connection,_2UL> connections;
  
  pSVar15 = (checker->super_Symbol).parentScope;
  this = pSVar15->compilation;
  depth_local = depth;
  args_2 = Compilation::allocAssertionDetails(this);
  args_2->symbol = &checker->super_Symbol;
  args_2->instanceLoc = (checker->super_Symbol).location;
  LVar25 = LookupLocation::after(&checker->super_Symbol);
  local_128._8_4_ = LVar25.index;
  stack0xfffffffffffffee8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (AssertionInstanceDetails *)0x0;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ =
       (pointer)((ulong)connections.
                        super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ &
                0xffffffffffffff00);
  local_168[0] = 1;
  local_1b8 = args_2;
  local_128._0_8_ = pSVar15;
  local_1b0 = BumpAllocator::
              emplace<slang::ast::CheckerInstanceBodySymbol,slang::ast::Compilation&,slang::ast::CheckerSymbol_const&,slang::ast::AssertionInstanceDetails&,slang::ast::ASTContext&,unsigned_int&,bool,slang::ast::InstanceFlags>
                        (&this->super_BumpAllocator,this,checker,args_2,(ASTContext *)local_128,
                         &depth_local,(bool *)&connections,local_168);
  local_1a8 = (checker->super_Symbol).originatingSyntax;
  (local_1b0->super_Symbol).originatingSyntax = local_1a8;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ =
       (pointer)connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.
                firstElement;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.len = 0;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.cap = 2;
  sVar4 = (checker->ports)._M_extent._M_extent_value;
  local_190 = checker;
  if (sVar4 != 0) {
    ppAVar17 = (checker->ports)._M_ptr;
    local_180 = ppAVar17 + sVar4;
    local_188 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                 *)&local_1b8->argumentMap;
    local_1a0 = this;
    do {
      if (((*ppAVar17)->super_Symbol).name._M_len != 0) {
        outputInitialSyntax = (ExpressionSyntax *)0x0;
        actualArg = createCheckerFormal(this,*ppAVar17,local_1b0,&outputInitialSyntax,
                                        (ASTContext *)local_128);
        this = local_1a0;
        local_138 = local_f8;
        local_168._12_4_ = local_128._12_4_;
        local_168._8_4_ = local_128._8_4_;
        local_148 = (TempVarSymbol *)local_108._0_8_;
        pRStack_140 = (RandomizeDetails *)local_108._8_8_;
        local_158.m_bits = local_128._16_8_;
        pSStack_150 = pSStack_110;
        local_168._0_8_ = local_128._0_8_;
        local_130._M_head_impl = (PropertyExprSyntax *)0x0;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = actualArg;
        hash = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
        pos0 = hash >> ((byte)(local_1b8->argumentMap).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                              .arrays.groups_size_index & 0x3f);
        pgVar5 = (local_1b8->argumentMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .arrays.groups_;
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        uVar19 = 0;
        uVar14 = pos0;
        do {
          pgVar2 = pgVar5 + uVar14;
          uVar20 = (uchar)uVar3;
          auVar24[0] = -(pgVar2->m[0].n == uVar20);
          uVar21 = (uchar)((uint)uVar3 >> 8);
          auVar24[1] = -(pgVar2->m[1].n == uVar21);
          uVar22 = (uchar)((uint)uVar3 >> 0x10);
          auVar24[2] = -(pgVar2->m[2].n == uVar22);
          uVar23 = (uchar)((uint)uVar3 >> 0x18);
          auVar24[3] = -(pgVar2->m[3].n == uVar23);
          auVar24[4] = -(pgVar2->m[4].n == uVar20);
          auVar24[5] = -(pgVar2->m[5].n == uVar21);
          auVar24[6] = -(pgVar2->m[6].n == uVar22);
          auVar24[7] = -(pgVar2->m[7].n == uVar23);
          auVar24[8] = -(pgVar2->m[8].n == uVar20);
          auVar24[9] = -(pgVar2->m[9].n == uVar21);
          auVar24[10] = -(pgVar2->m[10].n == uVar22);
          auVar24[0xb] = -(pgVar2->m[0xb].n == uVar23);
          auVar24[0xc] = -(pgVar2->m[0xc].n == uVar20);
          auVar24[0xd] = -(pgVar2->m[0xd].n == uVar21);
          auVar24[0xe] = -(pgVar2->m[0xe].n == uVar22);
          auVar24[0xf] = -(pgVar2->m[0xf].n == uVar23);
          uVar18 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
          if (uVar18 != 0) {
            ppVar16 = (local_1b8->argumentMap).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                      .arrays.elements_;
            do {
              uVar9 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              if (actualArg == ppVar16[uVar14 * 0xf + (ulong)uVar9].first) {
                ppVar16 = ppVar16 + uVar14 * 0xf + (ulong)uVar9;
                goto LAB_0033c921;
              }
              uVar18 = uVar18 - 1 & uVar18;
            } while (uVar18 != 0);
          }
          if ((pgVar5[uVar14].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) {
            ppVar16 = (value_type_pointer)0x0;
            goto LAB_0033c921;
          }
          uVar6 = (local_1b8->argumentMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  .arrays.groups_size_mask;
          lVar13 = uVar14 + uVar19;
          uVar19 = uVar19 + 1;
          uVar14 = lVar13 + 1U & uVar6;
        } while (uVar19 <= uVar6);
        ppVar16 = (value_type_pointer)0x0;
LAB_0033c921:
        if (ppVar16 == (value_type_pointer)0x0) {
          if ((local_1b8->argumentMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
              .size_ctrl.size <
              (local_1b8->argumentMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                      (&res,local_188,(arrays_type *)local_188,pos0,hash,&local_1b9,&actualArg,
                       (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                       local_168);
            psVar1 = &(local_1b8->argumentMap).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                      .size_ctrl.size;
            *psVar1 = *psVar1 + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                      (&res,local_188,hash,&local_1b9,&actualArg,
                       (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                       local_168);
          }
        }
        local_168._0_8_ = (pointer)0x0;
        local_168._8_8_ = 0;
        SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::
        emplace_back<slang::ast::CheckerInstanceBodySymbol&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax_const*&,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>
                  (&connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>
                   ,local_1b0,actualArg,&outputInitialSyntax,
                   (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                   local_168);
      }
      ppAVar17 = ppAVar17 + 1;
    } while (ppAVar17 != local_180);
  }
  pSVar7 = local_1a8[7].previewNode;
  if (pSVar7 != (SyntaxNode *)0x0) {
    pSVar8 = local_1a8[7].parent;
    pSVar15 = &local_1b0->super_Scope;
    lVar13 = 0;
    do {
      Scope::addMembers(pSVar15,*(SyntaxNode **)((long)&pSVar8->kind + lVar13));
      lVar13 = lVar13 + 8;
    } while ((long)pSVar7 << 3 != lVar13);
  }
  pCVar12 = BumpAllocator::
            emplace<slang::ast::CheckerInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::CheckerInstanceBodySymbol&>
                      (&this->super_BumpAllocator,&(local_190->super_Symbol).name,
                       &(local_190->super_Symbol).location,local_1b0);
  (pCVar12->super_InstanceSymbolBase).super_Symbol.originatingSyntax = local_1a8;
  iVar11 = SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::copy
                     (&connections.
                       super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>,
                      (EVP_PKEY_CTX *)this,src);
  (pCVar12->connections)._M_ptr = (pointer)CONCAT44(extraout_var,iVar11);
  (pCVar12->connections)._M_extent._M_extent_value = extraout_RDX;
  if (connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ !=
      (pointer)connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.
               firstElement) {
    operator_delete(connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>
                    .data_);
  }
  return pCVar12;
}

Assistant:

CheckerInstanceSymbol& CheckerInstanceSymbol::createInvalid(const CheckerSymbol& checker,
                                                            uint32_t depth) {
    auto scope = checker.getParentScope();
    SLANG_ASSERT(scope);

    auto& comp = scope->getCompilation();
    auto assertionDetails = comp.allocAssertionDetails();
    assertionDetails->symbol = &checker;
    assertionDetails->instanceLoc = checker.location;

    ASTContext context(*scope, LookupLocation::after(checker));
    auto body = comp.emplace<CheckerInstanceBodySymbol>(comp, checker, *assertionDetails, context,
                                                        depth,
                                                        /* isProcedural */ false,
                                                        InstanceFlags::Uninstantiated);

    auto checkerSyntax = checker.getSyntax();
    SLANG_ASSERT(checkerSyntax);
    body->setSyntax(*checkerSyntax);

    SmallVector<Connection> connections;
    for (auto port : checker.ports) {
        if (port->name.empty())
            continue;

        const ExpressionSyntax* outputInitialSyntax = nullptr;
        auto actualArg = createCheckerFormal(comp, *port, *body, outputInitialSyntax, context);

        assertionDetails->argumentMap.emplace(
            actualArg, std::make_tuple((const PropertyExprSyntax*)nullptr, context));
        connections.emplace_back(*body, *actualArg, outputInitialSyntax,
                                 std::span<const AttributeSymbol* const>{});
    }

    for (auto member : checkerSyntax->as<CheckerDeclarationSyntax>().members)
        body->addMembers(*member);

    auto instance = comp.emplace<CheckerInstanceSymbol>(checker.name, checker.location, *body);
    instance->setSyntax(*checkerSyntax);
    instance->connections = connections.copy(comp);
    return *instance;
}